

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c003::TestCheckArrayCloseTrue::RunImpl(TestCheckArrayCloseTrue *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_a0;
  int local_7c [5];
  TestDetails local_68;
  float local_44;
  float local_40 [2];
  float array2 [3];
  float array1 [3];
  TestResults results;
  TestCheckArrayCloseTrue *this_local;
  
  UnitTest::TestResults::TestResults((TestResults *)(array1 + 1),(TestReporter *)0x0);
  array2[1] = 1.0;
  array2[2] = 1.5;
  array1[0] = 2.0;
  local_40[0] = 1.01;
  local_40[1] = 1.51;
  array2[0] = 2.01;
  local_44 = 0.02;
  UnitTest::TestDetails::TestDetails(&local_68,"","","",0);
  UnitTest::CheckArrayClose<float[3],float[3],float>
            ((TestResults *)(array1 + 1),(float (*) [3])(array2 + 1),(float (*) [3])local_40,3,
             &local_44,&local_68);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_7c[1] = 0;
  local_7c[0] = UnitTest::TestResults::GetFailureCount((TestResults *)(array1 + 1));
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_a0,*ppTVar2,0xd2);
  UnitTest::CheckEqual<int,int>(results_00,local_7c + 1,local_7c,&local_a0);
  return;
}

Assistant:

TEST(CheckArrayCloseTrue)
{
    TestResults results;

    float const array1[3] = { 1.0f, 1.5f, 2.0f };
    float const array2[3] = { 1.01f, 1.51f, 2.01f };
    CheckArrayClose(results, array1, array2, 3, 0.02f, TestDetails("", "", "", 0));
    CHECK_EQUAL(0, results.GetFailureCount());
}